

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRFromMemory(float *out_rgba,uchar *memory,char **err)

{
  int iVar1;
  undefined8 *in_RDX;
  uchar *in_RSI;
  long in_RDI;
  int i;
  int c;
  int idxA;
  int idxB;
  int idxG;
  int idxR;
  int ret;
  EXRHeader exr_header;
  EXRImage exr_image;
  EXRVersion exr_version;
  int iStack_10904;
  undefined4 in_stack_fffffffffffef700;
  int iVar2;
  undefined4 in_stack_fffffffffffef704;
  int iVar3;
  undefined4 in_stack_fffffffffffef708;
  int iVar4;
  int iVar5;
  undefined4 in_stack_fffffffffffef70c;
  int iVar6;
  int iVar7;
  undefined4 in_stack_fffffffffffef710;
  int iVar8;
  int iVar9;
  EXRImage *in_stack_fffffffffffef718;
  char **in_stack_fffffffffffef7d0;
  uchar *in_stack_fffffffffffef7d8;
  EXRVersion *in_stack_fffffffffffef7e0;
  EXRHeader *in_stack_fffffffffffef7e8;
  long local_80;
  int local_78;
  EXRImage local_58;
  EXRVersion local_34;
  undefined8 *local_20;
  uchar *local_18;
  long local_10;
  int local_4;
  
  if ((in_RDI == 0) || (in_RSI == (uchar *)0x0)) {
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = "Invalid argument.\n";
    }
    local_4 = -3;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    InitEXRHeader((EXRHeader *)0x15abcc);
    local_4 = ParseEXRVersionFromMemory(&local_34,local_18);
    if ((local_4 == 0) &&
       (local_4 = ParseEXRHeaderFromMemory
                            (in_stack_fffffffffffef7e8,in_stack_fffffffffffef7e0,
                             in_stack_fffffffffffef7d8,in_stack_fffffffffffef7d0), local_4 == 0)) {
      InitEXRImage(&local_58);
      local_4 = LoadEXRImageFromMemory
                          (in_stack_fffffffffffef718,
                           (EXRHeader *)CONCAT44(local_4,in_stack_fffffffffffef710),
                           (uchar *)CONCAT44(in_stack_fffffffffffef70c,in_stack_fffffffffffef708),
                           (char **)CONCAT44(in_stack_fffffffffffef704,in_stack_fffffffffffef700));
      if (local_4 == 0) {
        iVar3 = -1;
        iVar4 = -1;
        iVar6 = -1;
        iVar8 = -1;
        for (iVar2 = 0; iVar2 < local_78; iVar2 = iVar2 + 1) {
          iVar1 = strcmp((char *)(local_80 + (long)iVar2 * 0x110),"R");
          iVar5 = iVar4;
          iVar7 = iVar6;
          iVar9 = iVar2;
          if ((((iVar1 != 0) &&
               (iVar1 = strcmp((char *)(local_80 + (long)iVar2 * 0x110),"G"), iVar5 = iVar4,
               iVar7 = iVar2, iVar9 = iVar8, iVar1 != 0)) &&
              (iVar1 = strcmp((char *)(local_80 + (long)iVar2 * 0x110),"B"), iVar5 = iVar2,
              iVar7 = iVar6, iVar9 = iVar8, iVar1 != 0)) &&
             (iVar1 = strcmp((char *)(local_80 + (long)iVar2 * 0x110),"A"), iVar5 = iVar4,
             iVar7 = iVar6, iVar9 = iVar8, iVar1 == 0)) {
            iVar3 = iVar2;
          }
          iVar4 = iVar5;
          iVar6 = iVar7;
          iVar8 = iVar9;
        }
        if (iVar8 == -1) {
          if (local_20 != (undefined8 *)0x0) {
            *local_20 = "R channel not found\n";
          }
          local_4 = -4;
        }
        else if (iVar6 == -1) {
          if (local_20 != (undefined8 *)0x0) {
            *local_20 = "G channel not found\n";
          }
          local_4 = -4;
        }
        else if (iVar4 == -1) {
          if (local_20 != (undefined8 *)0x0) {
            *local_20 = "B channel not found\n";
          }
          local_4 = -4;
        }
        else {
          for (iStack_10904 = 0; iStack_10904 < local_58.width * local_58.height;
              iStack_10904 = iStack_10904 + 1) {
            *(undefined4 *)(local_10 + (long)(iStack_10904 << 2) * 4) =
                 *(undefined4 *)(local_58.images[iVar8] + (long)iStack_10904 * 4);
            *(undefined4 *)(local_10 + (long)(iStack_10904 * 4 + 1) * 4) =
                 *(undefined4 *)(local_58.images[iVar6] + (long)iStack_10904 * 4);
            *(undefined4 *)(local_10 + (long)(iStack_10904 * 4 + 2) * 4) =
                 *(undefined4 *)(local_58.images[iVar4] + (long)iStack_10904 * 4);
            if (iVar3 < 1) {
              *(undefined4 *)(local_10 + (long)(iStack_10904 * 4 + 3) * 4) = 0x3f800000;
            }
            else {
              *(undefined4 *)(local_10 + (long)(iStack_10904 * 4 + 3) * 4) =
                   *(undefined4 *)(local_58.images[iVar3] + (long)iStack_10904 * 4);
            }
          }
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int LoadEXRFromMemory(float *out_rgba, const unsigned char *memory,
                      const char **err) {
  if (out_rgba == NULL || memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;

  InitEXRHeader(&exr_header);

  int ret = ParseEXRVersionFromMemory(&exr_version, memory);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  ret = ParseEXRHeaderFromMemory(&exr_header, &exr_version, memory, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  InitEXRImage(&exr_image);
  ret = LoadEXRImageFromMemory(&exr_image, &exr_header, memory, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exr_header.num_channels; c++) {
    if (strcmp(exr_header.channels[c].name, "R") == 0) {
      idxR = c;
    } else if (strcmp(exr_header.channels[c].name, "G") == 0) {
      idxG = c;
    } else if (strcmp(exr_header.channels[c].name, "B") == 0) {
      idxB = c;
    } else if (strcmp(exr_header.channels[c].name, "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Assume `out_rgba` have enough memory allocated.
  for (int i = 0; i < exr_image.width * exr_image.height; i++) {
    out_rgba[4 * i + 0] = reinterpret_cast<float **>(exr_image.images)[idxR][i];
    out_rgba[4 * i + 1] = reinterpret_cast<float **>(exr_image.images)[idxG][i];
    out_rgba[4 * i + 2] = reinterpret_cast<float **>(exr_image.images)[idxB][i];
    if (idxA > 0) {
      out_rgba[4 * i + 3] =
          reinterpret_cast<float **>(exr_image.images)[idxA][i];
    } else {
      out_rgba[4 * i + 3] = 1.0;
    }
  }

  return TINYEXR_SUCCESS;
}